

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O0

bool TestEthernetV2(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  ostream *poVar4;
  void *pvVar5;
  bool local_36;
  uint16_t local_34;
  uint16_t local_32;
  uint16_t local_30;
  bool failed;
  bool ret;
  uint16_t MacAddrIn;
  uint16_t MacAddrOutMid;
  uint16_t MacAddrOutLow;
  uint16_t chipID;
  uint32_t status;
  ofstream *logFile_local;
  BasePort *Port_local;
  AmpIO *Board_local;
  int curLine_local;
  
  _MacAddrOutLow = logFile;
  logFile_local = (ofstream *)Port;
  Port_local = (BasePort *)Board;
  Board_local._0_4_ = curLine;
  poVar4 = (ostream *)std::ostream::operator<<(logFile,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"=== Ethernet (KSZ8851) Test ===");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  uVar3 = BoardIO::GetFirmwareVersion((BoardIO *)Port_local);
  if (uVar3 < 5) {
    poVar4 = std::operator<<((ostream *)_MacAddrOutLow,
                             "   No Ethernet controller, firmware version = ");
    uVar3 = BoardIO::GetFirmwareVersion((BoardIO *)Port_local);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,uVar3);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    Board_local._7_1_ = false;
  }
  else {
    FpgaIO::ReadEthernetStatus((FpgaIO *)Port_local,(uint32_t *)&MacAddrIn);
    if ((_MacAddrIn & 0x80000000) == 0) {
      poVar4 = std::operator<<((ostream *)_MacAddrOutLow,"   No Ethernet controller, status = ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
      pvVar5 = (void *)std::ostream::operator<<(pvVar5,_MacAddrIn >> 0x10);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      Board_local._7_1_ = false;
    }
    else {
      poVar4 = std::operator<<((ostream *)_MacAddrOutLow,"   Ethernet controller status = ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
      pvVar5 = (void *)std::ostream::operator<<(pvVar5,_MacAddrIn >> 0x10);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      FpgaIO::WriteEthernetPhyReset((FpgaIO *)Port_local,0);
      Amp1394_Sleep(0.1);
      FpgaIO::ReadEthernetStatus((FpgaIO *)Port_local,(uint32_t *)&MacAddrIn);
      poVar4 = std::operator<<((ostream *)_MacAddrOutLow,"   After reset, status = ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
      pvVar5 = (void *)std::ostream::operator<<(pvVar5,_MacAddrIn >> 0x10);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      _failed = FpgaIO::ReadKSZ8851ChipID((FpgaIO *)Port_local);
      poVar4 = std::operator<<((ostream *)_MacAddrOutLow,"   Chip ID = ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
      pvVar5 = (void *)std::ostream::operator<<(pvVar5,_failed);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      if ((_failed & 0xfff0) == 0x8870) {
        bVar1 = true;
        local_32 = 0x8000;
        for (local_30 = 1; local_30 != 0 && local_32 != 0; local_30 = local_30 << 1) {
          poVar4 = std::operator<<((ostream *)_MacAddrOutLow,"   MAC address: ");
          std::ostream::operator<<(poVar4,std::hex);
          bVar2 = FpgaIO::WriteKSZ8851Reg((FpgaIO *)Port_local,'\x10',&local_30);
          if (bVar2) {
            poVar4 = std::operator<<((ostream *)_MacAddrOutLow,"write low = ");
            std::ostream::operator<<(poVar4,local_30);
          }
          bVar2 = FpgaIO::WriteKSZ8851Reg((FpgaIO *)Port_local,'\x12',&local_32);
          if (bVar2) {
            poVar4 = std::operator<<((ostream *)_MacAddrOutLow,", write mid = ");
            std::ostream::operator<<(poVar4,local_32);
          }
          local_34 = 0;
          bVar2 = FpgaIO::ReadKSZ8851Reg((FpgaIO *)Port_local,'\x10',&local_34);
          if (bVar2) {
            poVar4 = std::operator<<((ostream *)_MacAddrOutLow,", read low = ");
            std::ostream::operator<<(poVar4,local_34);
          }
          local_36 = local_30 != local_34;
          bVar2 = FpgaIO::ReadKSZ8851Reg((FpgaIO *)Port_local,'\x12',&local_34);
          if (bVar2) {
            poVar4 = std::operator<<((ostream *)_MacAddrOutLow,", read mid = ");
            std::ostream::operator<<(poVar4,local_34);
          }
          local_36 = local_32 != local_34 || local_36;
          if (local_36) {
            std::operator<<((ostream *)_MacAddrOutLow," ***");
            bVar1 = false;
          }
          std::ostream::operator<<(_MacAddrOutLow,std::endl<char,std::char_traits<char>>);
          local_32 = (uint16_t)((int)(uint)local_32 >> 1);
        }
        FpgaIO::WriteEthernetPhyReset((FpgaIO *)Port_local,0);
        Board_local._7_1_ = bVar1;
      }
      else {
        Board_local._7_1_ = false;
      }
    }
  }
  return Board_local._7_1_;
}

Assistant:

bool TestEthernetV2(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile)
{
    logFile << std::endl << "=== Ethernet (KSZ8851) Test ===" << std::endl;
    if (Board.GetFirmwareVersion() < 5) {
        logFile << "   No Ethernet controller, firmware version = " << Board.GetFirmwareVersion() << std::endl;
        return false;
    }
    uint32_t status;
    Board.ReadEthernetStatus(status);
    if (!(status & FpgaIO::ETH_STAT_PRESENT_V2)) {
        logFile << "   No Ethernet controller, status = " << std::hex << (status>>16) << std::endl;
        return false;
    }
    logFile << "   Ethernet controller status = " << std::hex << (status>>16) << std::endl;
    // Reset the board
    Board.WriteEthernetPhyReset();
    // Wait 100 msec
    Amp1394_Sleep(0.1);
    // Read the status
    Board.ReadEthernetStatus(status);
    logFile << "   After reset, status = " << std::hex << (status>>16) << std::endl;
    // Read the Chip ID (16-bit read)
    uint16_t chipID = Board.ReadKSZ8851ChipID();
    logFile << "   Chip ID = " << std::hex << chipID << std::endl;
    if ((chipID&0xfff0) != 0x8870)
        return false;
#if 0
    // Read Chip ID using 8-bit read
    // TODO: Reading from 0xC0 works (get 0x72), but not from 0xC1 (get 0xC1 instead of 0x88)
    uint8_t chipIDHigh;
    Board.ReadKSZ8851Reg(0xC1, chipIDHigh);
    logFile << "   Chip ID high (8-bit read) = " << std::hex << static_cast<int>(chipIDHigh) << std::endl;
    if (chipIDHigh != 0x88)
        return false;
#endif
    // Walking bit pattern on MAC address registers (R/W)
    // 0x10 is MARL (MAC Address Register Low)
    // 0x12 is MARM (MAC Address Register Middle)
    uint16_t MacAddrOutLow, MacAddrOutMid, MacAddrIn;
    bool ret = true;
    for (MacAddrOutLow = 0x0001, MacAddrOutMid = 0x8000;
         (MacAddrOutLow != 0) && (MacAddrOutMid != 0);
         MacAddrOutLow <<= 1, MacAddrOutMid >>= 1) {
        logFile << "   MAC address: " << std::hex;
        if (Board.WriteKSZ8851Reg(0x10, MacAddrOutLow))
            logFile << "write low = " << MacAddrOutLow;
        if (Board.WriteKSZ8851Reg(0x12, MacAddrOutMid))
            logFile << ", write mid = " << MacAddrOutMid;
        MacAddrIn = 0;
        bool failed = false;
        if (Board.ReadKSZ8851Reg(0x10, MacAddrIn))
            logFile << ", read low = " << MacAddrIn;
        if (MacAddrOutLow != MacAddrIn) failed = true;
        if (Board.ReadKSZ8851Reg(0x12, MacAddrIn))
            logFile << ", read mid = " << MacAddrIn;
        if (MacAddrOutMid != MacAddrIn) failed = true;
        if (failed) {
            logFile << " ***";
            ret = false;
        }
        logFile << std::endl;
    }
    // Reset the board again (to restore MAC address)
    Board.WriteEthernetPhyReset();
    return ret;
}